

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::RepeatedEnumFieldGenerator::GenerateParsingCodeFromPacked
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "int length = input.readRawVarint32();\nint oldLimit = input.pushLimit(length);\nwhile(input.getBytesUntilLimit() > 0) {\n"
                    );
  io::Printer::Indent(printer);
  (*(this->super_FieldGenerator)._vptr_FieldGenerator[0xb])(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,&this->variables_,"}\ninput.popLimit(oldLimit);\n");
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateParsingCodeFromPacked(io::Printer* printer) const {
  // Wrap GenerateParsingCode's contents with a while loop.

  printer->Print(variables_,
    "int length = input.readRawVarint32();\n"
    "int oldLimit = input.pushLimit(length);\n"
    "while(input.getBytesUntilLimit() > 0) {\n");
  printer->Indent();

  GenerateParsingCode(printer);

  printer->Outdent();
  printer->Print(variables_,
    "}\n"
    "input.popLimit(oldLimit);\n");
}